

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

size_t __thiscall
absl::lts_20250127::time_internal::cctz::anon_unknown_0::FileZoneInfoSource::Read
          (FileZoneInfoSource *this,void *ptr,size_t size)

{
  size_t __ptr;
  unsigned_long *puVar1;
  FILE *__stream;
  size_t sVar2;
  size_t nread;
  size_t size_local;
  void *ptr_local;
  FileZoneInfoSource *this_local;
  
  nread = size;
  size_local = (size_t)ptr;
  ptr_local = this;
  puVar1 = std::min<unsigned_long>(&nread,&this->len_);
  __ptr = size_local;
  sVar2 = *puVar1;
  nread = sVar2;
  __stream = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get(&this->fp_);
  sVar2 = fread((void *)__ptr,1,sVar2,__stream);
  this->len_ = this->len_ - sVar2;
  return sVar2;
}

Assistant:

std::size_t Read(void* ptr, std::size_t size) override {
    size = std::min(size, len_);
    std::size_t nread = fread(ptr, 1, size, fp_.get());
    len_ -= nread;
    return nread;
  }